

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_select_node.cpp
# Opt level: O1

void __thiscall
duckdb::Binder::BindModifiers
          (Binder *this,BoundQueryNode *result,idx_t table_index,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *sql_types,SelectBindState *bind_state)

{
  ResultModifierType RVar1;
  pointer puVar2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar4;
  ClientContext *pCVar5;
  pointer pBVar6;
  Binder *pBVar7;
  idx_t table_index_00;
  _Alloc_hider _Var8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar9;
  SelectBindState *pSVar10;
  vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *this_00;
  pointer pBVar11;
  BoundDistinctModifier *pBVar12;
  pointer pEVar13;
  BoundOrderModifier *pBVar14;
  reference pvVar15;
  const_reference other;
  BoundColumnRefExpression *this_01;
  pointer pBVar16;
  BoundLimitModifier *pBVar17;
  InternalException *this_02;
  pointer puVar18;
  pointer pBVar19;
  bool bVar20;
  BoundOrderByNode *order_node;
  ulong __n;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  pointer this_03;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_04;
  ColumnBinding binding;
  OrderByNullType null_order;
  OrderType order_type;
  templated_unique_single_t expr_1;
  OrderByNullType local_aa;
  OrderType local_a9;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_a8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_a0;
  idx_t local_98;
  _Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false> local_90;
  Binder *local_88;
  string local_80;
  BoundOrderModifier *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_58;
  SelectBindState *local_50;
  vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *local_48;
  unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
  *local_40;
  pointer local_38;
  
  this_03 = (result->modifiers).
            super_vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (result->modifiers).
             super_vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_98 = table_index;
  local_88 = this;
  local_58 = names;
  local_50 = bind_state;
  if (this_03 != local_38) {
    do {
      pSVar10 = local_50;
      pvVar9 = local_58;
      pBVar11 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                ::operator->(this_03);
      RVar1 = pBVar11->type;
      local_40 = this_03;
      if (RVar1 == LIMIT_MODIFIER) {
        pBVar11 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                  ::operator->(this_03);
        pBVar17 = BoundResultModifier::Cast<duckdb::BoundLimitModifier>(pBVar11);
        table_index_00 = local_98;
        AssignReturnType(&(pBVar17->limit_val).expression,local_98,pvVar9,sql_types,pSVar10);
        AssignReturnType(&(pBVar17->offset_val).expression,table_index_00,pvVar9,sql_types,pSVar10);
      }
      else if (RVar1 == ORDER_MODIFIER) {
        pBVar11 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                  ::operator->(this_03);
        pBVar14 = BoundResultModifier::Cast<duckdb::BoundOrderModifier>(pBVar11);
        pBVar19 = (pBVar14->orders).
                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar6 = (pBVar14->orders).
                 super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                 super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pBVar19 != pBVar6) {
          local_48 = (vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                     &pBVar14->orders;
          bVar20 = false;
          local_60 = pBVar14;
          do {
            local_a8._M_head_impl =
                 (pBVar19->expression).
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pBVar19->expression).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
            FinalizeBindOrderExpression
                      ((duckdb *)&local_80,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_a8,local_98,pvVar9,sql_types,pSVar10);
            _Var8._M_p = local_80._M_dataplus._M_p;
            local_80._M_dataplus._M_p = (pointer)0x0;
            _Var3._M_head_impl =
                 (pBVar19->expression).
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pBVar19->expression).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (Expression *)_Var8._M_p;
            if (_Var3._M_head_impl != (Expression *)0x0) {
              (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
            }
            if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
            }
            local_80._M_dataplus._M_p = (pointer)0x0;
            if (local_a8._M_head_impl != (Expression *)0x0) {
              (*((local_a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            this_00 = local_48;
            local_a8._M_head_impl = (Expression *)0x0;
            if ((pBVar19->expression).
                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                _M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl ==
                (Expression *)0x0) {
              bVar20 = true;
            }
            pBVar19 = pBVar19 + 1;
          } while (pBVar19 != pBVar6);
          pBVar14 = local_60;
          if (bVar20) {
            pvVar15 = vector<duckdb::BoundOrderByNode,_true>::operator[]
                                ((vector<duckdb::BoundOrderByNode,_true> *)local_48,0);
            local_a9 = pvVar15->type;
            pvVar15 = vector<duckdb::BoundOrderByNode,_true>::operator[]
                                ((vector<duckdb::BoundOrderByNode,_true> *)this_00,0);
            local_aa = pvVar15->null_order;
            ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
            _M_erase_at_end((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                             *)this_00,*(pointer *)this_00);
            pBVar14 = local_60;
            if ((sql_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                (sql_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              __n = 0;
              do {
                other = vector<duckdb::LogicalType,_true>::operator[](sql_types,__n);
                this_01 = (BoundColumnRefExpression *)operator_new(0x70);
                LogicalType::LogicalType((LogicalType *)&local_80,other);
                binding.column_index = __n;
                binding.table_index = local_98;
                BoundColumnRefExpression::BoundColumnRefExpression
                          (this_01,(LogicalType *)&local_80,binding,0);
                local_90._M_head_impl = this_01;
                LogicalType::~LogicalType((LogicalType *)&local_80);
                if (__n < (ulong)((long)(pvVar9->
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pvVar9->
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5)) {
                  pBVar16 = unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                            ::operator->((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                                          *)&local_90);
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](pvVar9,__n);
                  ::std::__cxx11::string::_M_assign
                            ((string *)&(pBVar16->super_Expression).super_BaseExpression.alias);
                }
                ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
                emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<duckdb::BoundColumnRefExpression>,true>>
                          (local_48,&local_a9,&local_aa,
                           (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                            *)&local_90);
                if (local_90._M_head_impl != (BoundColumnRefExpression *)0x0) {
                  (*((local_90._M_head_impl)->super_Expression).super_BaseExpression.
                    _vptr_BaseExpression[1])();
                }
                __n = __n + 1;
                pBVar14 = local_60;
              } while (__n < (ulong)(((long)(sql_types->
                                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            ).
                                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(sql_types->
                                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            ).
                                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                    -0x5555555555555555));
            }
          }
        }
        pBVar7 = local_88;
        pBVar6 = (pBVar14->orders).
                 super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                 super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pBVar19 = (pBVar14->orders).
                       super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                       .
                       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                       ._M_impl.super__Vector_impl_data._M_start; pBVar19 != pBVar6;
            pBVar19 = pBVar19 + 1) {
          pCVar5 = pBVar7->context;
          pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(&pBVar19->expression);
          ExpressionBinder::PushCollation
                    (pCVar5,&pBVar19->expression,&pEVar13->return_type,ALL_COLLATIONS);
        }
      }
      else if (RVar1 == DISTINCT_MODIFIER) {
        pBVar11 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                  ::operator->(this_03);
        pBVar12 = BoundResultModifier::Cast<duckdb::BoundDistinctModifier>(pBVar11);
        pSVar10 = local_50;
        pvVar9 = local_58;
        puVar2 = (pBVar12->target_distincts).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pBVar7 = local_88;
        for (puVar18 = (pBVar12->target_distincts).
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; local_88 = pBVar7,
            puVar18 != puVar2; puVar18 = puVar18 + 1) {
          local_a0._M_head_impl =
               (puVar18->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (puVar18->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          FinalizeBindOrderExpression
                    ((duckdb *)&local_80,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_a0,local_98,pvVar9,sql_types,pSVar10);
          _Var8._M_p = local_80._M_dataplus._M_p;
          local_80._M_dataplus._M_p = (pointer)0x0;
          _Var3._M_head_impl =
               (puVar18->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (puVar18->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)_Var8._M_p
          ;
          if (_Var3._M_head_impl != (Expression *)0x0) {
            (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
          }
          if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
          }
          local_80._M_dataplus._M_p = (pointer)0x0;
          if (local_a0._M_head_impl != (Expression *)0x0) {
            (*((local_a0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_a0._M_head_impl = (Expression *)0x0;
          if ((puVar18->
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0)
          {
            this_02 = (InternalException *)__cxa_allocate_exception(0x10);
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_80,"DISTINCT ON ORDER BY ALL not supported","");
            InternalException::InternalException(this_02,&local_80);
            __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pBVar7 = local_88;
        }
        puVar4 = (pBVar12->target_distincts).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_04 = (pBVar12->target_distincts).
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_04 != puVar4;
            this_04 = this_04 + 1) {
          pCVar5 = pBVar7->context;
          pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(this_04);
          ExpressionBinder::PushCollation(pCVar5,this_04,&pEVar13->return_type,ALL_COLLATIONS);
        }
      }
      this_03 = local_40 + 1;
    } while (this_03 != local_38);
  }
  return;
}

Assistant:

void Binder::BindModifiers(BoundQueryNode &result, idx_t table_index, const vector<string> &names,
                           const vector<LogicalType> &sql_types, const SelectBindState &bind_state) {
	for (auto &bound_mod : result.modifiers) {
		switch (bound_mod->type) {
		case ResultModifierType::DISTINCT_MODIFIER: {
			auto &distinct = bound_mod->Cast<BoundDistinctModifier>();
			// set types of distinct targets
			for (auto &expr : distinct.target_distincts) {
				expr = FinalizeBindOrderExpression(std::move(expr), table_index, names, sql_types, bind_state);
				if (!expr) {
					throw InternalException("DISTINCT ON ORDER BY ALL not supported");
				}
			}
			for (auto &expr : distinct.target_distincts) {
				ExpressionBinder::PushCollation(context, expr, expr->return_type);
			}
			break;
		}
		case ResultModifierType::LIMIT_MODIFIER: {
			auto &limit = bound_mod->Cast<BoundLimitModifier>();
			AssignReturnType(limit.limit_val.GetExpression(), table_index, names, sql_types, bind_state);
			AssignReturnType(limit.offset_val.GetExpression(), table_index, names, sql_types, bind_state);
			break;
		}
		case ResultModifierType::ORDER_MODIFIER: {
			auto &order = bound_mod->Cast<BoundOrderModifier>();
			bool order_by_all = false;
			for (auto &order_node : order.orders) {
				auto &expr = order_node.expression;
				expr = FinalizeBindOrderExpression(std::move(expr), table_index, names, sql_types, bind_state);
				if (!expr) {
					order_by_all = true;
				}
			}
			if (order_by_all) {
				D_ASSERT(order.orders.size() == 1);
				auto order_type = order.orders[0].type;
				auto null_order = order.orders[0].null_order;
				order.orders.clear();
				for (idx_t i = 0; i < sql_types.size(); i++) {
					auto expr = make_uniq<BoundColumnRefExpression>(sql_types[i], ColumnBinding(table_index, i));
					if (i < names.size()) {
						expr->SetAlias(names[i]);
					}
					order.orders.emplace_back(order_type, null_order, std::move(expr));
				}
			}
			for (auto &order_node : order.orders) {
				auto &expr = order_node.expression;
				ExpressionBinder::PushCollation(context, order_node.expression, expr->return_type);
			}
			break;
		}
		default:
			break;
		}
	}
}